

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
soplex::Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::Array
          (Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *this,int n)

{
  (this->data).
  super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).
  super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).
  super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
  ::resize(&this->data,(long)n);
  return;
}

Assistant:

explicit
   Array(int n = 0)
   {
      data.resize(n);
   }